

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZHelpers.h
# Opt level: O0

void s_send<std::basic_string_view<char,std::char_traits<char>>>
               (socket_t *socket,basic_string_view<char,_std::char_traits<char>_> *value,
               string_view trace,int flags)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined8 in_stack_ffffffffffffff70;
  string_view *in_stack_ffffffffffffff78;
  char *__lhs;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  char local_69 [9];
  allocator<char> *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  string local_48 [72];
  
  bVar1 = s_try_send<std::basic_string_view<char,std::char_traits<char>>>
                    ((socket_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
  if (!bVar1) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    __lhs = local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    std::operator+(__lhs,__rhs);
    std::runtime_error::runtime_error((runtime_error *)__rhs,local_48);
    __cxa_throw(__rhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void s_send(zmq::socket_t *socket, const T &value, std::string_view trace,
            int flags = 0) {
    if (!s_try_send<T>(socket, value, flags)) {
        throw std::runtime_error("s_send failed " + std::string(trace));
    }
}